

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

vector<hta::Row,_std::allocator<hta::Row>_> *
hta::convert_timevalues_smooth
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,
          vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *raw_tvs,TimePoint begin,
          TimePoint end,Duration interval)

{
  double minimum;
  pointer pTVar1;
  duration dVar2;
  long lVar3;
  Aggregate other;
  Aggregate other_00;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar4;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar5;
  pointer pTVar6;
  type partial_duration;
  Aggregate partial_interval;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_d8;
  Duration local_d0;
  Aggregate local_c8;
  Aggregate local_90;
  Aggregate local_60;
  
  (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.__r = interval.__r;
  local_d8.__d.__r =
       (duration)
       (duration)
       end.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
       __d.__r;
  std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve
            (__return_storage_ptr__,
             ((long)end.
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r -
             (long)begin.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r) / interval.__r + 1);
  pTVar6 = (raw_tvs->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (raw_tvs->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar6) {
    __assert_fail("raw_tvs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x108,
                  "std::vector<Row> hta::convert_timevalues_smooth(const std::vector<TimeValue> &, TimePoint, TimePoint, Duration)"
                 );
  }
  tVar4.__d.__r =
       (duration)
       (pTVar6->time).
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  if ((long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r <= (long)tVar4.__d.__r) {
    tVar4.__d.__r =
         (duration)
         (duration)
         begin.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
  }
  while( true ) {
    if (pTVar6 == pTVar1) {
      return __return_storage_ptr__;
    }
    dVar2.__r = (pTVar6->time).
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
    if ((long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <= dVar2.__r) break;
    pTVar6 = pTVar6 + 1;
    tVar4.__d.__r = (duration)(duration)dVar2.__r;
  }
  while( true ) {
    if ((long)local_d8.__d.__r <=
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      return __return_storage_ptr__;
    }
    local_e8.__d.__r =
         (duration)
         (duration)
         begin.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    if ((pTVar6->time).
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r < (long)begin.
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r) break;
    tVar5.__d.__r =
         (duration)
         (duration)
         (interval.__r +
         (long)begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
    if ((long)local_d8.__d.__r <=
        interval.__r +
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      tVar5.__d.__r = (duration)(duration)local_d8;
    }
    local_c8.minimum = INFINITY;
    local_c8.maximum = -INFINITY;
    local_c8.integral = 0.0;
    local_c8.active_time.__r = 0;
    local_c8.sum = 0.0;
    local_c8.count = 0;
    while( true ) {
      if (pTVar6 == pTVar1) {
        std::vector<hta::Row,std::allocator<hta::Row>>::
        emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::Clock::time_point&,hta::Aggregate&>
                  ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,&local_e0,
                   (time_point *)&local_e8,&local_c8);
        return __return_storage_ptr__;
      }
      lVar3 = (pTVar6->time).
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r;
      if ((long)tVar5.__d.__r <= lVar3) break;
      Aggregate::Aggregate(&local_60,pTVar6->value,(Duration)(lVar3 - (long)tVar4.__d.__r));
      other.maximum = local_60.maximum;
      other.minimum = local_60.minimum;
      other.sum = local_60.sum;
      other.count = local_60.count;
      other.integral = local_60.integral;
      other.active_time.__r = local_60.active_time.__r;
      Aggregate::operator+=(&local_c8,other);
      tVar4.__d.__r =
           (duration)
           (pTVar6->time).
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      pTVar6 = pTVar6 + 1;
    }
    local_d0.__r = (long)tVar5.__d.__r - (long)tVar4.__d.__r;
    minimum = pTVar6->value;
    Aggregate::Aggregate(&local_90,minimum,minimum,0.0,0,(double)local_d0.__r * minimum,&local_d0);
    other_00.maximum = local_90.maximum;
    other_00.minimum = local_90.minimum;
    other_00.sum = local_90.sum;
    other_00.count = local_90.count;
    other_00.integral = local_90.integral;
    other_00.active_time.__r = local_90.active_time.__r;
    Aggregate::operator+=(&local_c8,other_00);
    std::vector<hta::Row,std::allocator<hta::Row>>::
    emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::Clock::time_point&,hta::Aggregate&>
              ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,&local_e0,
               (time_point *)&local_e8,&local_c8);
    begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
              ((long)local_e8.__d.__r + local_e0.__r);
    tVar4.__d.__r = tVar5.__d.__r;
    interval.__r = local_e0.__r;
  }
  __assert_fail("tv_it->time >= current_begin",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x11d,
                "std::vector<Row> hta::convert_timevalues_smooth(const std::vector<TimeValue> &, TimePoint, TimePoint, Duration)"
               );
}

Assistant:

std::vector<Row> convert_timevalues_smooth(const std::vector<TimeValue>& raw_tvs, TimePoint begin,
                                           TimePoint end, Duration interval)
{
    std::vector<Row> rows;
    rows.reserve((end - begin) / interval + 1);
    assert(raw_tvs.size() > 0);
    auto tv_it = raw_tvs.begin();
    auto tv_end = raw_tvs.end();
    auto previous_tp = std::min(begin, tv_it->time);

    for (; tv_it != tv_end && tv_it->time < begin; ++tv_it)
    {
        previous_tp = tv_it->time;
    }
    // Now, at least one is true:
    // 1) tv_it->time >= begin
    // 2) tv_it == tv_end
    // let's exit early to ensure the asserted loop invariant 1)
    // allowing this to return an empty dataset
    if (tv_it == tv_end)
    {
        return rows;
    }

    for (TimePoint current_begin = begin; current_begin < end; current_begin += interval)
    {
        assert(tv_it->time >= current_begin);
        const auto current_end = std::min<TimePoint>(current_begin + interval, end);

        Aggregate agg;
        for (; tv_it != tv_end && tv_it->time < current_end; ++tv_it)
        {
            agg += Aggregate(tv_it->value, tv_it->time - previous_tp);
            previous_tp = tv_it->time;
        }
        if (tv_it == tv_end)
        {
            rows.emplace_back(interval, current_begin, agg);
            return rows;
        }
        // tv_it->time >= next_begin
        auto partial_duration = current_end - previous_tp;
        // WTF clang-format?!
        Aggregate partial_interval{
            tv_it->value,    tv_it->value, 0, 0, tv_it->value * partial_duration.count(),
            partial_duration
        };
        agg += partial_interval;
        previous_tp = current_end;
        rows.emplace_back(interval, current_begin, agg);
    }
    return rows;
}